

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&>
          (internal *this,basic_string_view<char> format_str,
          format_string_checker<char,_fmt::v5::internal::error_handler> *handler)

{
  parse_context_type *this_00;
  size_t *psVar1;
  bool bVar2;
  internal iVar3;
  uint uVar4;
  internal *piVar5;
  internal *piVar6;
  format_string_checker<char,_fmt::v5::internal::error_handler> *pfVar7;
  internal *piVar8;
  internal *piVar9;
  char *pcVar10;
  internal *end;
  id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
  local_38;
  
  pfVar7 = (format_string_checker<char,_fmt::v5::internal::error_handler> *)format_str.size_;
  end = (internal *)(format_str.data_ + (long)this);
  this_00 = &pfVar7->context_;
  do {
    if (this == end) {
      return;
    }
    piVar6 = this;
    if (*this == (internal)0x7b) {
LAB_001d370f:
      piVar5 = this;
      if (this != piVar6) {
        do {
          piVar9 = piVar5;
          bVar2 = piVar5 != piVar6;
          if (piVar5 != piVar6) {
            iVar3 = *piVar5;
            while (bVar2 = true, iVar3 != (internal)0x7d) {
              piVar8 = piVar9 + 1;
              piVar9 = piVar6;
              bVar2 = piVar8 != piVar6;
              if (piVar8 == piVar6) break;
              piVar9 = piVar8;
              iVar3 = *piVar8;
            }
          }
          if (bVar2) {
            if ((piVar9 + 1 == piVar6) || (piVar9[1] != (internal)0x7d)) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              goto LAB_001d377c;
            }
            piVar5 = piVar9 + 2;
            bVar2 = true;
          }
          else {
LAB_001d377c:
            bVar2 = false;
          }
        } while (bVar2);
      }
      piVar6 = piVar6 + 1;
      if (piVar6 == end) {
        pcVar10 = "invalid format string";
        goto LAB_001d37c5;
      }
      if (*piVar6 != (internal)0x7b) {
        if (*piVar6 == (internal)0x7d) {
          uVar4 = (pfVar7->context_).next_arg_id_;
          if ((int)uVar4 < 0) {
            error_handler::on_error
                      ((error_handler *)this_00,
                       "cannot switch from manual to automatic argument indexing");
            uVar4 = 0;
          }
          else {
            (pfVar7->context_).next_arg_id_ = uVar4 + 1;
          }
          pfVar7->arg_id_ = uVar4;
          error_handler::on_error((error_handler *)this_00,"argument index out of range");
        }
        else {
          local_38.handler = pfVar7;
          piVar6 = (internal *)
                   parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&,char>>
                             ((char *)piVar6,(char *)end,&local_38);
          if (piVar6 == end) {
            iVar3 = (internal)0x0;
          }
          else {
            iVar3 = *piVar6;
          }
          if (iVar3 != (internal)0x7d) {
            if (iVar3 == (internal)0x3a) {
              piVar6 = piVar6 + 1;
              pcVar10 = (pfVar7->context_).format_str_.data_;
              (pfVar7->context_).format_str_.data_ = (char *)piVar6;
              psVar1 = &(pfVar7->context_).format_str_.size_;
              *psVar1 = (size_t)(pcVar10 + (*psVar1 - (long)piVar6));
              if ((piVar6 != end) && (*piVar6 == (internal)0x7d)) goto LAB_001d38bb;
              pcVar10 = "unknown format specifier";
            }
            else {
              pcVar10 = "missing \'}\' in format string";
            }
LAB_001d37c5:
            error_handler::on_error((error_handler *)this_00,pcVar10);
            goto LAB_001d383a;
          }
        }
      }
LAB_001d38bb:
      this = piVar6 + 1;
      bVar2 = true;
    }
    else {
      bVar2 = true;
      iVar3 = *this;
      while (iVar3 != (internal)0x7b) {
        piVar6 = piVar6 + 1;
        bVar2 = piVar6 != end;
        if (piVar6 == end) break;
        iVar3 = *piVar6;
      }
      piVar5 = this;
      if (bVar2) goto LAB_001d370f;
      do {
        piVar6 = piVar5;
        bVar2 = piVar5 != end;
        if (piVar5 != end) {
          iVar3 = *piVar5;
          while (bVar2 = true, iVar3 != (internal)0x7d) {
            piVar9 = piVar6 + 1;
            piVar6 = end;
            bVar2 = piVar9 != end;
            if (piVar9 == end) break;
            piVar6 = piVar9;
            iVar3 = *piVar9;
          }
        }
        if (bVar2) {
          if ((piVar6 + 1 == end) || (piVar6[1] != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_001d3834;
          }
          piVar5 = piVar6 + 2;
          bVar2 = true;
        }
        else {
LAB_001d3834:
          bVar2 = false;
        }
      } while (bVar2);
LAB_001d383a:
      bVar2 = false;
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}